

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O3

bool __thiscall
text_subtitles::TextSubtitlesRender::rasterText(TextSubtitlesRender *this,string *text)

{
  undefined4 *puVar1;
  long lVar2;
  uint32_t uVar3;
  pointer ppVar4;
  int iVar5;
  pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *j;
  pointer ppVar6;
  long lVar7;
  string *line;
  int iVar8;
  int iVar9;
  iterator __end2;
  ulong uVar10;
  float fVar11;
  vector<int,_std::allocator<int>_> xSize;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  txtParts;
  SIZE mSize;
  vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> fontStack;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  int local_124;
  int local_120;
  int local_11c;
  void *local_118;
  iterator iStack_110;
  int *local_108;
  float local_100;
  uint local_fc;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  string *local_e0;
  Font *local_d8;
  string *local_d0;
  string *local_c8;
  ulong local_c0;
  ulong local_b8;
  undefined8 local_b0;
  long local_a0 [2];
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 local_80;
  int local_78;
  int local_74;
  undefined8 local_70;
  vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  memset(this->m_pData,0,(long)this->m_height * (long)this->m_width * 4);
  local_68.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  splitStr_abi_cxx11_(&local_48,(text->_M_dataplus)._M_p,'\n');
  local_d0 = (string *)&this->m_font;
  local_d8 = &this->m_initFont;
  std::__cxx11::string::_M_assign((string *)local_d8);
  fVar11 = (this->m_font).m_lineSpacing;
  (this->m_initFont).m_color = (this->m_font).m_color;
  (this->m_initFont).m_lineSpacing = fVar11;
  iVar9 = (this->m_font).m_opts;
  fVar11 = (this->m_font).m_borderWidth;
  uVar3 = (this->m_font).m_charset;
  (this->m_initFont).m_size = (this->m_font).m_size;
  (this->m_initFont).m_opts = iVar9;
  (this->m_initFont).m_borderWidth = fVar11;
  (this->m_initFont).m_charset = uVar3;
  local_11c = 0;
  local_c8 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    line = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      processTxtLine(&local_f8,this,line,&local_68);
      ppVar4 = local_f8.
               super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar6 = local_f8.
               super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_f8.
          super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_f8.
          super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001d2074:
        local_108 = (int *)0x0;
        iStack_110._M_current = (int *)0x0;
        local_118 = (void *)0x0;
        fVar11 = 0.0;
      }
      else {
        do {
          uVar10 = CONCAT71((int7)(uVar10 >> 8),
                            (byte)uVar10 | ((byte)(ppVar6->first).m_opts & 0x10) >> 4);
          ppVar6 = ppVar6 + 1;
        } while (ppVar6 != local_f8.
                           super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        local_118 = (void *)0x0;
        iStack_110._M_current = (int *)0x0;
        local_108 = (int *)0x0;
        if (local_f8.
            super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_f8.
            super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001d2074;
        local_120 = 0;
        local_124 = 0;
        iVar8 = 0;
        iVar9 = 0;
        ppVar6 = local_f8.
                 super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_e0 = line;
        do {
          (*this->_vptr_TextSubtitlesRender[2])(this,ppVar6);
          (*this->_vptr_TextSubtitlesRender[4])(this,&ppVar6->second,&local_b0);
          if (iVar9 <= local_b0._4_4_) {
            iVar9 = local_b0._4_4_;
          }
          iVar5 = (*this->_vptr_TextSubtitlesRender[5])(this);
          if (local_124 <= iVar5) {
            local_124 = (*this->_vptr_TextSubtitlesRender[5])(this);
          }
          iVar5 = (*this->_vptr_TextSubtitlesRender[6])(this);
          if (local_120 <= iVar5) {
            local_120 = (*this->_vptr_TextSubtitlesRender[6])(this);
          }
          if (iStack_110._M_current == local_108) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_118,iStack_110,(int *)&local_b0);
          }
          else {
            *iStack_110._M_current = (int)local_b0;
            iStack_110._M_current = iStack_110._M_current + 1;
          }
          iVar8 = iVar8 + (int)local_b0;
          ppVar6 = ppVar6 + 1;
        } while (ppVar6 != ppVar4);
        fVar11 = (float)iVar9;
        line = local_e0;
        if (local_f8.
            super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_f8.
            super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_fc = (uint)uVar10;
          local_c0 = (ulong)(uint)((this->m_width - iVar8) / 2);
          uVar10 = 0;
          lVar7 = 0x38;
          iVar9 = 0;
          local_100 = fVar11;
          do {
            ppVar4 = local_f8.
                     super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_b0 = local_a0;
            lVar2 = *(long *)((long)local_f8.
                                    super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x38);
            local_b8 = uVar10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,lVar2,
                       *(long *)((long)local_f8.
                                       super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x30) +
                       lVar2);
            local_80 = *(undefined8 *)((long)ppVar4 + lVar7 + -8);
            puVar1 = (undefined4 *)((long)ppVar4 + lVar7 + -0x18);
            local_90 = *puVar1;
            uStack_8c = puVar1[1];
            uStack_88 = puVar1[2];
            uStack_84 = puVar1[3];
            (*this->_vptr_TextSubtitlesRender[2])(this,(string *)&local_b0);
            local_78 = (int)local_c0 + iVar9;
            iVar8 = (*this->_vptr_TextSubtitlesRender[5])(this);
            local_74 = (*this->_vptr_TextSubtitlesRender[6])(this);
            local_74 = ((local_124 + local_11c) - (iVar8 + local_120)) + local_74;
            local_70._0_4_ = this->m_width;
            local_70._4_4_ = this->m_height;
            (*this->_vptr_TextSubtitlesRender[7])
                      (this,(long)&((local_f8.
                                     super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first).m_name.
                                   _M_dataplus._M_p + lVar7,&local_78);
            uVar10 = local_b8;
            iVar9 = iVar9 + *(int *)((long)local_118 + local_b8 * 4);
            if (local_b0 != local_a0) {
              operator_delete(local_b0,local_a0[0] + 1);
            }
            uVar10 = uVar10 + 1;
            lVar7 = lVar7 + 0x58;
          } while (uVar10 < (ulong)(((long)local_f8.
                                           super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_f8.
                                           super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0x2e8ba2e8ba2e8ba3));
          uVar10 = (ulong)local_fc;
          line = local_e0;
          fVar11 = local_100;
        }
      }
      lVar7 = lroundf(fVar11 * (this->m_font).m_lineSpacing);
      if (local_118 != (void *)0x0) {
        operator_delete(local_118,(long)local_108 - (long)local_118);
      }
      local_11c = local_11c + (int)lVar7;
      std::
      vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_f8);
      line = line + 1;
    } while (line != local_c8);
  }
  (*this->_vptr_TextSubtitlesRender[8])(this);
  std::__cxx11::string::_M_assign(local_d0);
  fVar11 = (this->m_initFont).m_lineSpacing;
  (this->m_font).m_color = (this->m_initFont).m_color;
  (this->m_font).m_lineSpacing = fVar11;
  iVar9 = (this->m_initFont).m_opts;
  fVar11 = (this->m_initFont).m_borderWidth;
  uVar3 = (this->m_initFont).m_charset;
  (this->m_font).m_size = (this->m_initFont).m_size;
  (this->m_font).m_opts = iVar9;
  (this->m_font).m_borderWidth = fVar11;
  (this->m_font).m_charset = uVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::~vector(&local_68);
  return (bool)((byte)uVar10 & 1);
}

Assistant:

bool TextSubtitlesRender::rasterText(const std::string& text)
{
    bool forced = false;
    memset(m_pData, 0, static_cast<size_t>(m_width) * m_height * 4);
    vector<Font> fontStack;
    const vector<string> lines = splitStr(text.c_str(), '\n');
    int curY = 0;
    m_initFont = m_font;
    for (auto& i : lines)
    {
        vector<pair<Font, string>> txtParts = processTxtLine(i, fontStack);
        for (const auto& j : txtParts)
        {
            if (j.first.m_opts & Font::FORCED)
                forced = true;
        }

        int ySize = 0;
        int tWidth = 0;
        int maxHeight = 0;
        int maxBaseLine = 0;
        vector<int> xSize;
        for (auto& j : txtParts)
        {
            setFont(j.first);
            SIZE mSize;
            getTextSize(j.second, &mSize);
            ySize = FFMAX(ySize, mSize.cy);
            maxHeight = FFMAX(maxHeight, getLineSpacing());
            maxBaseLine = FFMAX(maxBaseLine, getBaseline());
            xSize.push_back(mSize.cx);
            tWidth += mSize.cx;
        }
        const int xOffs = (m_width - tWidth) / 2;
        int curX = 0;
        for (size_t j = 0; j < txtParts.size(); j++)
        {
            Font font(txtParts[j].first);
            setFont(font);

            RECT rect = {curX + xOffs, curY + (maxHeight - getLineSpacing()) - (maxBaseLine - getBaseline()), m_width,
                         m_height};
            drawText(txtParts[j].second, &rect);

            curX += xSize[j];
        }
        curY += lround(static_cast<float>(ySize) * m_font.m_lineSpacing);
    }
    flushRasterBuffer();
    m_font = m_initFont;

    return forced;
}